

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBodyEasy.cpp
# Opt level: O1

void __thiscall
chrono::ChBodyEasyConvexHull::SetupBody
          (ChBodyEasyConvexHull *this,
          vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *points,
          double density,bool visualize,bool collide,shared_ptr<chrono::ChMaterialSurface> *material
          )

{
  double dVar1;
  ChTriangleMeshConnected *pCVar2;
  element_type *peVar3;
  pointer pCVar4;
  pointer pCVar5;
  element_type *peVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  uint __val;
  uint uVar7;
  ChTriangleMeshShape *pCVar8;
  long *plVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  uint uVar11;
  undefined7 in_register_00000009;
  _func_int **pp_Var12;
  ulong uVar13;
  uint __len;
  uint uVar14;
  ulong uVar15;
  ChConvexHullLibraryWrapper lh;
  shared_ptr<chrono::ChTriangleMeshShape> vshape;
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> points_reduced;
  ChVector<double> baricenter;
  double mass;
  string __str;
  ChMatrix33<double> inertia;
  ChConvexHullLibraryWrapper local_1c1;
  ChTriangleMeshShape *local_1c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1b8;
  undefined4 local_1ac;
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> local_1a8;
  shared_ptr<chrono::ChMaterialSurface> *local_190;
  element_type *local_188;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_180;
  shared_ptr<chrono::ChVisualModel> local_178;
  shared_ptr<chrono::ChVisualShape> local_168;
  ChVector<double> local_158;
  double local_140;
  double local_138;
  undefined1 local_128 [16];
  double dStack_118;
  double dStack_110;
  double dStack_108;
  double dStack_100;
  double dStack_f8;
  double dStack_f0;
  double local_e8;
  undefined1 local_d8 [16];
  _func_int *p_Stack_c8;
  double dStack_c0;
  double local_b8;
  undefined1 auStack_b0 [16];
  double dStack_a0;
  ChMatrix33<double> local_98;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  local_1ac = (undefined4)CONCAT71(in_register_00000009,collide);
  local_138 = density;
  pCVar8 = (ChTriangleMeshShape *)ChVisualShape::operator_new((ChVisualShape *)0x98,(size_t)points);
  ChTriangleMeshShape::ChTriangleMeshShape(pCVar8);
  local_1c0 = pCVar8;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChTriangleMeshShape*>
            (&local_1b8,pCVar8);
  collision::bt_utils::ChConvexHullLibraryWrapper::ChConvexHullLibraryWrapper(&local_1c1);
  pCVar2 = (local_1c0->trimesh).
           super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  p_Var10 = (local_1c0->trimesh).
            super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
    }
  }
  collision::bt_utils::ChConvexHullLibraryWrapper::ComputeHull(&local_1c1,points,pCVar2);
  if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
  }
  pCVar8 = local_1c0;
  if (visualize) {
    uVar14 = (this->super_ChBody).super_ChPhysicsItem.super_ChObj.m_identifier;
    __val = -uVar14;
    if (0 < (int)uVar14) {
      __val = uVar14;
    }
    __len = 1;
    if (9 < __val) {
      uVar13 = (ulong)__val;
      uVar7 = 4;
      do {
        __len = uVar7;
        uVar11 = (uint)uVar13;
        if (uVar11 < 100) {
          __len = __len - 2;
          goto LAB_0051a9da;
        }
        if (uVar11 < 1000) {
          __len = __len - 1;
          goto LAB_0051a9da;
        }
        if (uVar11 < 10000) goto LAB_0051a9da;
        uVar13 = uVar13 / 10000;
        uVar7 = __len + 4;
      } while (99999 < uVar11);
      __len = __len + 1;
    }
LAB_0051a9da:
    local_128._0_8_ = &dStack_118;
    local_190 = material;
    std::__cxx11::string::_M_construct((ulong)local_128,(char)__len - (char)((int)uVar14 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)(local_128._0_8_ + (ulong)(uVar14 >> 0x1f)),__len,__val);
    plVar9 = (long *)std::__cxx11::string::replace((ulong)local_128,0,(char *)0x0,0x983bb1);
    material = local_190;
    pp_Var12 = (_func_int **)(plVar9 + 2);
    if ((_func_int **)*plVar9 == pp_Var12) {
      p_Stack_c8 = *pp_Var12;
      dStack_c0 = (double)plVar9[3];
      local_d8._0_8_ = &p_Stack_c8;
    }
    else {
      p_Stack_c8 = *pp_Var12;
      local_d8._0_8_ = (_func_int **)*plVar9;
    }
    local_d8._8_8_ = plVar9[1];
    *plVar9 = (long)pp_Var12;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    std::__cxx11::string::_M_assign((string *)&pCVar8->name);
    if ((_func_int **)local_d8._0_8_ != &p_Stack_c8) {
      operator_delete((void *)local_d8._0_8_,(ulong)(p_Stack_c8 + 1));
    }
    if ((double *)local_128._0_8_ != &dStack_118) {
      operator_delete((void *)local_128._0_8_,(long)dStack_118 + 1);
    }
    p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x40);
    p_Var10->_M_use_count = 1;
    p_Var10->_M_weak_count = 1;
    p_Var10->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b33b18;
    p_Var10[1]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var10[1]._M_use_count = 0;
    p_Var10[1]._M_weak_count = 0;
    p_Var10[2]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var10[2]._M_use_count = 0;
    p_Var10[2]._M_weak_count = 0;
    p_Var10[2]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var10[2]._M_use_count = 0;
    p_Var10[2]._M_weak_count = 0;
    p_Var10[3]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var10[3]._M_use_count = 0;
    p_Var10[3]._M_weak_count = 0;
    local_168.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &local_1c0->super_ChVisualShape;
    local_168.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = local_1b8._M_pi;
    if (local_1b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_1b8._M_pi)->_M_use_count = (local_1b8._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_1b8._M_pi)->_M_use_count = (local_1b8._M_pi)->_M_use_count + 1;
      }
    }
    local_128._0_8_ = 1.0;
    register0x00001200 = ZEXT416(0) << 0x40;
    dStack_110 = 0.0;
    local_d8._0_8_ = &PTR__ChFrame_00b2b308;
    dStack_c0 = 0.0;
    local_b8 = 1.0;
    dStack_a0 = 0.0;
    unique0x10001430 = register0x00001200;
    auStack_b0 = register0x00001200;
    ChMatrix33<double>::ChMatrix33(&local_98,(ChQuaternion<double> *)local_128);
    ChVisualModel::AddShape((ChVisualModel *)(p_Var10 + 1),&local_168,(ChFrame<double> *)local_d8);
    if (local_168.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_168.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
    }
    local_178.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (ChVisualModel *)(p_Var10 + 1);
    local_178.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = p_Var10;
    ChPhysicsItem::AddVisualModel((ChPhysicsItem *)this,&local_178);
    if (local_178.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_178.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
  }
  local_158.m_data[0] = 0.0;
  local_158.m_data[1] = 0.0;
  local_158.m_data[2] = 0.0;
  pCVar2 = (local_1c0->trimesh).
           super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  p_Var10 = (local_1c0->trimesh).
            super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
    }
  }
  geometry::ChTriangleMeshConnected::ComputeMassProperties
            (pCVar2,true,&local_140,&local_158,(ChMatrix33<double> *)local_d8);
  if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
  }
  uVar14 = 0;
  while( true ) {
    peVar3 = (local_1c0->trimesh).
             super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    p_Var10 = (local_1c0->trimesh).
              super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi;
    if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
      }
    }
    pCVar4 = (peVar3->m_vertices).
             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pCVar5 = (peVar3->m_vertices).
             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
    }
    uVar15 = (ulong)uVar14;
    uVar13 = ((long)pCVar4 - (long)pCVar5 >> 3) * -0x5555555555555555;
    if (uVar13 < uVar15 || uVar13 - uVar15 == 0) break;
    peVar3 = (local_1c0->trimesh).
             super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    p_Var10 = (local_1c0->trimesh).
              super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi;
    if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
      }
    }
    pCVar4 = (peVar3->m_vertices).
             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    dVar1 = pCVar4[uVar15].m_data[1];
    pCVar4[uVar15].m_data[0] = pCVar4[uVar15].m_data[0] - local_158.m_data[0];
    pCVar4[uVar15].m_data[1] = dVar1 - local_158.m_data[1];
    pCVar4[uVar15].m_data[2] = pCVar4[uVar15].m_data[2] - local_158.m_data[2];
    if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
    }
    uVar14 = uVar14 + 1;
  }
  (this->super_ChBody).density = (float)local_138;
  ChVariablesBodyOwnMass::SetBodyMass(&(this->super_ChBody).variables,local_138 * local_140);
  local_128._0_8_ = local_138 * (double)local_d8._0_8_;
  dStack_110 = local_138 * dStack_c0;
  dStack_118 = local_138 * (double)p_Stack_c8;
  local_128._8_8_ = local_138 * (double)local_d8._8_8_;
  dStack_108 = local_138 * local_b8;
  dStack_100 = local_138 * (double)auStack_b0._0_8_;
  dStack_f8 = local_138 * (double)auStack_b0._8_8_;
  dStack_f0 = local_138 * dStack_a0;
  local_e8 = local_138 *
             local_98.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  ChBody::SetInertia(&this->super_ChBody,(ChMatrix33<double> *)local_128);
  if ((char)local_1ac != '\0') {
    if ((material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
        == (element_type *)0x0) {
      __assert_fail("material",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChBodyEasy.cpp"
                    ,0x11c,
                    "void chrono::ChBodyEasyConvexHull::SetupBody(std::vector<ChVector<>> &, double, bool, bool, std::shared_ptr<ChMaterialSurface>)"
                   );
    }
    local_1a8.
    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    local_1a8.
    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1a8.
    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    peVar3 = (local_1c0->trimesh).
             super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    p_Var10 = (local_1c0->trimesh).
              super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi;
    if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
      }
    }
    std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::resize
              (&local_1a8,
               ((long)(peVar3->m_vertices).
                      super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(peVar3->m_vertices).
                      super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
    if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
    }
    uVar14 = 0;
    while( true ) {
      peVar3 = (local_1c0->trimesh).
               super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      p_Var10 = (local_1c0->trimesh).
                super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
      if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
        }
      }
      pCVar4 = (peVar3->m_vertices).
               super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pCVar5 = (peVar3->m_vertices).
               super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
      }
      uVar15 = (ulong)uVar14;
      uVar13 = ((long)pCVar4 - (long)pCVar5 >> 3) * -0x5555555555555555;
      if (uVar13 < uVar15 || uVar13 - uVar15 == 0) break;
      peVar3 = (local_1c0->trimesh).
               super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      p_Var10 = (local_1c0->trimesh).
                super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
      if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
        }
      }
      pCVar4 = (peVar3->m_vertices).
               super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (pCVar4 != local_1a8.
                    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) {
        local_1a8.
        super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar15].m_data[0] = pCVar4[uVar15].m_data[0];
        local_1a8.
        super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar15].m_data[1] = pCVar4[uVar15].m_data[1];
        local_1a8.
        super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar15].m_data[2] = pCVar4[uVar15].m_data[2];
      }
      if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
      }
      uVar14 = uVar14 + 1;
    }
    peVar6 = (this->super_ChBody).collision_model.
             super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    p_Var10 = (this->super_ChBody).collision_model.
              super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
      }
    }
    (*peVar6->_vptr_ChCollisionModel[3])();
    if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
    }
    peVar6 = (this->super_ChBody).collision_model.
             super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    p_Var10 = (this->super_ChBody).collision_model.
              super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
      }
    }
    local_188 = (material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>
                )._M_ptr;
    local_180 = (material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>
                )._M_refcount._M_pi;
    if (local_180 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_180->_M_use_count = local_180->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_180->_M_use_count = local_180->_M_use_count + 1;
      }
    }
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0;
    stack0xfffffffffffffee0 = ZEXT816(0);
    dStack_110 = 0.0;
    dStack_100 = 0.0;
    dStack_f8 = 0.0;
    dStack_f0 = 0.0;
    local_128._0_8_ = 1.0;
    dStack_108 = 1.0;
    local_e8 = 1.0;
    (*peVar6->_vptr_ChCollisionModel[0xf])(peVar6,&local_188,&local_1a8);
    if (local_180 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_180);
    }
    if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
    }
    peVar6 = (this->super_ChBody).collision_model.
             super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    p_Var10 = (this->super_ChBody).collision_model.
              super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
      }
    }
    (*peVar6->_vptr_ChCollisionModel[4])();
    if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
    }
    ChBody::SetCollide(&this->super_ChBody,true);
    if (local_1a8.
        super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1a8.
                      super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1a8.
                            super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1a8.
                            super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  peVar3 = (local_1c0->trimesh).
           super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  p_Var10 = (local_1c0->trimesh).
            super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
    }
  }
  (this->m_mesh).
  super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar3;
  this_00 = (this->m_mesh).
            super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  (this->m_mesh).
  super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var10;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (local_1b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1b8._M_pi);
  }
  return;
}

Assistant:

void ChBodyEasyConvexHull::SetupBody(std::vector<ChVector<>>& points,
                                     double density,
                                     bool visualize,
                                     bool collide,
                                     std::shared_ptr<ChMaterialSurface> material) {
    auto vshape = chrono_types::make_shared<ChTriangleMeshShape>();
    collision::bt_utils::ChConvexHullLibraryWrapper lh;
    lh.ComputeHull(points, *vshape->GetMesh());
    if (visualize) {
        vshape->SetName("chull_mesh_" + std::to_string(GetIdentifier()));
        auto vmodel = chrono_types::make_shared<ChVisualModel>();
        vmodel->AddShape(vshape);
        this->AddVisualModel(vmodel);
    }

    double mass;
    ChVector<> baricenter;
    ChMatrix33<> inertia;
    vshape->GetMesh()->ComputeMassProperties(true, mass, baricenter, inertia);

    // Translate the convex hull baricenter so that body origin is also baricenter
    for (unsigned int i = 0; i < vshape->GetMesh()->getCoordsVertices().size(); ++i)
        vshape->GetMesh()->getCoordsVertices()[i] -= baricenter;

    this->SetDensity((float)density);
    this->SetMass(mass * density);
    this->SetInertia(inertia * density);

    if (collide) {
        assert(material);
        // avoid passing to collision the inner points discarded by convex hull
        // processor, so use mesh vertexes instead of all argument points
        std::vector<ChVector<>> points_reduced;
        points_reduced.resize(vshape->GetMesh()->getCoordsVertices().size());
        for (unsigned int i = 0; i < vshape->GetMesh()->getCoordsVertices().size(); ++i)
            points_reduced[i] = vshape->GetMesh()->getCoordsVertices()[i];

        GetCollisionModel()->ClearModel();
        GetCollisionModel()->AddConvexHull(material, points_reduced);
        GetCollisionModel()->BuildModel();
        SetCollide(true);
    }

    m_mesh = vshape->GetMesh();
}